

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  buffer_appender<char> out_00;
  buffer_appender<char> out_01;
  bool bVar1;
  int value;
  type tVar2;
  char (*format_str) [5];
  size_t sVar3;
  uint32_t in_ESI;
  buffer_appender<char> it;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *in_stack_ffffffffffffff78;
  buffer_appender<char> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  buffer<char> *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffffc8) [3];
  undefined4 in_stack_ffffffffffffffd0;
  long lVar4;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t uVar5;
  basic_string_view<char> local_10;
  
  buffer<char>::try_resize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  lVar4 = 8;
  uVar5 = in_ESI;
  bVar1 = is_negative<int,_0>(in_ESI);
  if (bVar1) {
    in_ESI = -in_ESI;
    lVar4 = lVar4 + 1;
  }
  value = count_digits(in_ESI);
  tVar2 = to_unsigned<int>(value);
  format_str = (char (*) [5])(lVar4 + (ulong)tVar2);
  buffer_appender<char>::buffer_appender(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar3 = basic_string_view<char>::size(&local_10);
  if (sVar3 <= 500U - (long)format_str) {
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ = uVar5;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         in_stack_ffffffffffffffe0;
    format_to<fmt::v7::detail::buffer_appender<char>,char[5],fmt::v7::basic_string_view<char>&,char_const(&)[3],true>
              (out_00,format_str,
               (basic_string_view<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  out_01.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ = uVar5;
  out_01.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
       in_stack_ffffffffffffffe0;
  format_to<fmt::v7::detail::buffer_appender<char>,char[5],char_const(&)[7],int&,true>
            (out_01,format_str,(char (*) [7])CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
             (int *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, "{}{}", message, SEP);
  format_to(it, "{}{}", ERROR_STR, error_code);
  assert(out.size() <= inline_buffer_size);
}